

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.h
# Opt level: O2

ON_SubDEdge * __thiscall ON_SubDLevel::AddEdge(ON_SubDLevel *this,ON_SubDEdge *edge)

{
  ON_SubDEdge *pOVar1;
  
  (this->m_aggregates).m_bDirtyEdgeAttributes = true;
  if (edge != (ON_SubDEdge *)0x0) {
    if (this->m_edge[1] == (ON_SubDEdge *)0x0) {
      this->m_edge[0] = edge;
      pOVar1 = (ON_SubDEdge *)0x0;
    }
    else {
      this->m_edge[1]->m_next_edge = edge;
      pOVar1 = this->m_edge[1];
    }
    edge->m_prev_edge = pOVar1;
    this->m_edge[1] = edge;
    edge->m_next_edge = (ON_SubDEdge *)0x0;
    this->m_edge_count = this->m_edge_count + 1;
    ResetEdgeArray(this);
  }
  return edge;
}

Assistant:

const ON_SubDEdge* AddEdge(class ON_SubDEdge* edge)
  {
    m_aggregates.m_bDirtyEdgeAttributes = true;
    if (nullptr == edge)
      return nullptr;
    if (nullptr == m_edge[1])
    {
      m_edge[0] = edge;
      edge->m_prev_edge = nullptr;
    }
    else
    {
      m_edge[1]->m_next_edge = edge;
      edge->m_prev_edge = m_edge[1];
    }
    m_edge[1] = edge;
    edge->m_next_edge = nullptr;
    m_edge_count++;
    ResetEdgeArray();
    return edge;
  }